

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

bool iDynTree::transformFromAxes
               (Axis *xAxis,Axis *yAxis,Axis *zAxis,Transform *refFrame_H_frame,double tol)

{
  ulong uVar1;
  Position *in_RCX;
  Axis *in_RDX;
  Axis *in_RSI;
  Axis *in_RDI;
  double in_XMM0_Qa;
  RealScalar RVar2;
  ReturnType RVar3;
  Rotation rot;
  Direction zDirectionCheck;
  bool ok;
  Position yzIntersectionOnZ;
  Position yzIntersectionOnY;
  Position xyIntersectionOnY;
  Position xyIntersectionOnX;
  Index in_stack_fffffffffffffc00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc08;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc10;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc18;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc90;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc98;
  Rotation local_2f8 [176];
  Direction local_248 [2];
  double in_stack_fffffffffffffde8;
  Position *in_stack_fffffffffffffdf0;
  Position *in_stack_fffffffffffffdf8;
  Axis *in_stack_fffffffffffffe00;
  Axis *in_stack_fffffffffffffe08;
  Axis local_158;
  Axis local_128;
  Axis local_f8;
  Axis local_c8;
  undefined1 local_91;
  Position local_90 [24];
  Position local_78 [24];
  Position local_60 [24];
  Position local_48 [24];
  double local_30;
  Position *local_28;
  bool local_1;
  
  local_30 = in_XMM0_Qa;
  local_28 = in_RCX;
  iDynTree::Position::Position(local_48);
  iDynTree::Position::Position(local_60);
  iDynTree::Position::Position(local_78);
  iDynTree::Position::Position(local_90);
  iDynTree::Axis::Axis(&local_c8,in_RDI);
  iDynTree::Axis::Axis(&local_f8,in_RSI);
  local_91 = closestPoints(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                           in_stack_fffffffffffffde8);
  if ((bool)local_91) {
    iDynTree::Axis::Axis(&local_128,in_RSI);
    iDynTree::Axis::Axis(&local_158,in_RDX);
    local_91 = closestPoints(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                             in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                             in_stack_fffffffffffffde8);
    if ((bool)local_91) {
      toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
      toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      RVar2 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)in_RDX);
      if (RVar2 <= local_30) {
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
        operator-(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
        RVar2 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)in_RDX);
        if (RVar2 <= local_30) {
          toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
          toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
          operator-(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
          RVar2 = Eigen::
                  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                          *)in_RDX);
          if (RVar2 <= local_30) {
            Direction::Direction((Direction *)0x3a5378);
            iDynTree::Axis::getDirection();
            toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
            iDynTree::Axis::getDirection();
            toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
            Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ::cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                      (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
            toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
            Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
                       (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
            iDynTree::Axis::getDirection();
            uVar1 = iDynTree::Direction::isParallel(local_248,local_30);
            if ((uVar1 & 1) == 0) {
              iDynTree::reportError("","transformFromAxes","x cross y is not parallel to z");
              local_1 = false;
            }
            else {
              toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
              iDynTree::Axis::getDirection();
              toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
              RVar3 = Eigen::
                      MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
                      dot<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                                ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)in_RDI,
                                 (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)in_RDX);
              if (0.0 <= RVar3) {
                iDynTree::Transform::setPosition(local_28);
                iDynTree::Rotation::Rotation(local_2f8);
                iDynTree::Axis::getDirection();
                toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
                toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
                Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::
                block<3,1>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,(Index)in_RSI);
                Eigen::
                Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>::
                operator=((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                           *)in_RDI,
                          (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)in_RDX);
                iDynTree::Axis::getDirection();
                toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
                toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
                Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::
                block<3,1>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,(Index)in_RSI);
                Eigen::
                Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>::
                operator=((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                           *)in_RDI,
                          (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)in_RDX);
                iDynTree::Axis::getDirection();
                toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
                toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
                Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::
                block<3,1>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,(Index)in_RSI);
                Eigen::
                Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>::
                operator=((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                           *)in_RDI,
                          (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)in_RDX);
                iDynTree::Transform::setRotation((Rotation *)local_28);
                local_1 = true;
              }
              else {
                iDynTree::reportError
                          ("","transformFromAxes","x cross y is not in the same direction of z");
                local_1 = false;
              }
            }
          }
          else {
            iDynTree::reportError
                      ("","transformFromAxes",
                       "xy intersection is not coincident with yz intersection");
            local_1 = false;
          }
        }
        else {
          iDynTree::reportError("","transformFromAxes","x and y are not incident");
          local_1 = false;
        }
      }
      else {
        iDynTree::reportError("","transformFromAxes","x and y are not incident");
        local_1 = false;
      }
    }
    else {
      iDynTree::reportError("","transformFromAxes","yAxis is parallel with the zAxis");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError("","transformFromAxes","xAxis is parallel with the yAxis");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool transformFromAxes(const Axis xAxis,
                       const Axis yAxis,
                       const Axis zAxis,
                             Transform& refFrame_H_frame,
                             double tol=1e-5)
{
    // Check axis are consistent (they share the origin)
    Position xyIntersectionOnX, xyIntersectionOnY, yzIntersectionOnY, yzIntersectionOnZ;
    bool ok = closestPoints(xAxis, yAxis, xyIntersectionOnX, xyIntersectionOnY, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","xAxis is parallel with the yAxis");
        return false;
    }

    ok = closestPoints(yAxis, zAxis, yzIntersectionOnY, yzIntersectionOnZ, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","yAxis is parallel with the zAxis");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(xyIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(yzIntersectionOnY)-toEigen(yzIntersectionOnZ)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(yzIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","xy intersection is not coincident with yz intersection");
        return false;
    }

    iDynTree::Direction zDirectionCheck;
    toEigen(zDirectionCheck) = toEigen(xAxis.getDirection()).cross(toEigen(yAxis.getDirection()));
    if (!zDirectionCheck.isParallel(zAxis.getDirection(),tol))
    {
        reportError("","transformFromAxes","x cross y is not parallel to z");
        return false;
    }

    if ((toEigen(zDirectionCheck).dot(toEigen(zAxis.getDirection()))) < 0.0)
    {
        reportError("","transformFromAxes","x cross y is not in the same direction of z");
        return false;
    }

    refFrame_H_frame.setPosition(xyIntersectionOnX);
    iDynTree::Rotation rot;
    toEigen(rot).block<3,1>(0,0) = toEigen(xAxis.getDirection());
    toEigen(rot).block<3,1>(0,1) = toEigen(yAxis.getDirection());
    toEigen(rot).block<3,1>(0,2) = toEigen(zAxis.getDirection());
    refFrame_H_frame.setRotation(rot);

    return true;
}